

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_suite.cpp
# Opt level: O0

void sum_array_real(void)

{
  back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  __result;
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_298;
  basic_variable<std::allocator<char>_> *local_270;
  iterator local_260;
  iterator local_248;
  basic_variable<std::allocator<char>_> *local_230;
  basic_variable<std::allocator<char>_> *local_228;
  basic_variable<std::allocator<char>_> *local_220;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  basic_variable<std::allocator<char>_> local_1b8;
  undefined1 local_188 [24];
  variable expect;
  iterator local_138;
  iterator local_120;
  undefined1 local_108 [8];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  result;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d8,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,20.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_78,300.0);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar1 = &local_d8;
  local_270 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_270 = local_270 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_270);
  } while (local_270 != pbVar1);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  __result = std::
             back_inserter<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                       ((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                         *)local_108);
  expect.storage._40_8_ =
       std::
       partial_sum<trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::back_insert_iterator<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
                 (&local_120,&local_138,__result);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  local_220 = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_220,1.0);
  local_220 = &local_1e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_220,21.0);
  local_220 = &local_1b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_220,321.0);
  local_188._0_8_ = &local_218;
  local_188._8_8_ = 3;
  init_00._M_len = (size_type)pbVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10),
             (basic_array<std::allocator<char>_> *)local_188._0_8_,init_00);
  local_298 = (basic_variable<std::allocator<char>_> *)local_188;
  do {
    local_298 = local_298 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_298);
  } while (local_298 != &local_218);
  local_228 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                       *)local_108);
  local_230 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                     *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_248,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partial_sum_suite.cpp"
             ,0x90,"void sum_array_real()",local_228,local_230,&local_248,&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void sum_array_real()
{
    variable data = array::make({ 1.0, 20.0, 300.0 });
    std::vector<variable> result;
    std::partial_sum(data.begin(), data.end(), std::back_inserter(result));
    variable expect = array::make({ 1.0, 21.0, 321.0 });
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<variable>());
}